

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::yarn5>(yarn5 *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  string res;
  string local_58;
  double local_38;
  
  lVar7 = std::chrono::_V2::system_clock::now();
  iVar1 = (r->P).a[0];
  iVar2 = (r->P).a[1];
  iVar3 = (r->P).a[2];
  iVar4 = (r->P).a[3];
  iVar5 = (r->P).a[4];
  uVar13 = (ulong)(uint)(r->S).r[0];
  iVar9 = 0;
  lVar17 = 0x1000000;
  iVar10 = (r->S).r[1];
  iVar8 = (r->S).r[2];
  iVar14 = (r->S).r[3];
  iVar11 = (r->S).r[4];
  do {
    iVar15 = iVar14;
    iVar14 = iVar8;
    iVar8 = iVar10;
    iVar10 = (int)uVar13;
    (r->S).r[4] = iVar15;
    uVar16 = (long)iVar15 * (long)iVar4 + (long)iVar14 * (long)iVar3 +
             (long)iVar8 * (long)iVar2 + (long)iVar10 * (long)iVar1;
    uVar13 = uVar16 + 0x80000001fffffffe;
    if (uVar16 < 0x7ffffffe00000002) {
      uVar13 = uVar16;
    }
    (r->S).r[3] = iVar14;
    (r->S).r[2] = iVar8;
    uVar13 = (long)iVar11 * (long)iVar5 + uVar13;
    uVar16 = (uVar13 >> 0x1f) + (uVar13 & 0x7fffffff);
    uVar13 = uVar16 - 0x1fffffffc;
    if ((uint)(uVar16 >> 2) < 0x7fffffff) {
      uVar13 = uVar16;
    }
    uVar16 = uVar13 - 0xfffffffe;
    if (uVar13 < 0xfffffffe) {
      uVar16 = uVar13;
    }
    uVar13 = uVar16 + 0x80000001;
    if (uVar16 < 0x7fffffff) {
      uVar13 = uVar16;
    }
    (r->S).r[1] = iVar10;
    iVar11 = (int)uVar13;
    (r->S).r[0] = iVar11;
    uVar6 = 0;
    if (iVar11 != 0) {
      uVar6 = (uint)((ulong)*(uint *)(trng::yarn5::g + (uVar13 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn5::g + (long)(iVar11 >> 0x10) * 4 + 0x40000)) &
              0x7fffffff;
      iVar11 = (int)((ulong)*(uint *)(trng::yarn5::g + (uVar13 & 0xffff) * 4) *
                     (ulong)*(uint *)(trng::yarn5::g + (long)(iVar11 >> 0x10) * 4 + 0x40000) >> 0x1f
                    );
      uVar12 = uVar6 + iVar11;
      uVar6 = uVar6 + 0x80000001 + iVar11;
      if (uVar12 < 0x7fffffff) {
        uVar6 = uVar12;
      }
    }
    iVar9 = iVar9 + uVar6;
    lVar17 = lVar17 + -1;
    iVar11 = iVar15;
  } while (lVar17 != 0);
  lVar17 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar17 - lVar7) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar9;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}